

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

oonf_rfc5444_protocol * oonf_rfc5444_add_protocol(char *name,_Bool fixed_local_port)

{
  avl_node *paVar1;
  oonf_rfc5444_protocol *local_50;
  oonf_rfc5444_protocol *local_48;
  oonf_rfc5444_protocol *protocol;
  _Bool fixed_local_port_local;
  char *name_local;
  
  paVar1 = avl_find(&_protocol_tree,name);
  if (paVar1 == (avl_node *)0x0) {
    local_50 = (oonf_rfc5444_protocol *)0x0;
  }
  else {
    local_50 = (oonf_rfc5444_protocol *)&paVar1[-0xc].right;
  }
  local_48 = local_50;
  if (local_50 == (oonf_rfc5444_protocol *)0x0) {
    local_48 = (oonf_rfc5444_protocol *)oonf_class_malloc(&_protocol_memcookie);
    if (local_48 == (oonf_rfc5444_protocol *)0x0) {
      return (oonf_rfc5444_protocol *)0x0;
    }
    strscpy((char *)local_48,name,0x20);
    local_48->fixed_local_port = fixed_local_port;
    (local_48->_node).key = local_48;
    avl_insert(&_protocol_tree,&local_48->_node);
    memcpy(&local_48->reader,&_reader_template,0x78);
    memcpy(&local_48->writer,&_writer_template,0x140);
    (local_48->writer).msg_buffer = local_48->_msg_buffer;
    (local_48->writer).addrtlv_buffer = local_48->_addrtlv_buffer;
    rfc5444_reader_init(&local_48->reader);
    rfc5444_writer_init(&local_48->writer);
    (local_48->writer).message_generation_notifier = _cb_msggen_notifier;
    oonf_duplicate_set_add(&local_48->forwarded_set,OONF_DUPSET_16BIT);
    oonf_duplicate_set_add(&local_48->processed_set,OONF_DUPSET_16BIT);
    avl_init(&local_48->_interface_tree,avl_comp_strcasecmp,false);
  }
  if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x1d7,
             (void *)0x0,0,"Add protocol %s (refcount was %d)",name,local_48->_refcount);
  }
  local_48->_refcount = local_48->_refcount + 1;
  return local_48;
}

Assistant:

struct oonf_rfc5444_protocol *
oonf_rfc5444_add_protocol(const char *name, bool fixed_local_port) {
  struct oonf_rfc5444_protocol *protocol;

  protocol = avl_find_element(&_protocol_tree, name, protocol, _node);
  if (!protocol) {
    protocol = oonf_class_malloc(&_protocol_memcookie);
    if (protocol == NULL) {
      return NULL;
    }

    /* set name */
    strscpy(protocol->name, name, sizeof(protocol->name));
    protocol->fixed_local_port = fixed_local_port;

    /* hook into global protocol tree */
    protocol->_node.key = protocol->name;
    avl_insert(&_protocol_tree, &protocol->_node);

    /* initialize rfc5444 reader/writer */
    memcpy(&protocol->reader, &_reader_template, sizeof(_reader_template));
    memcpy(&protocol->writer, &_writer_template, sizeof(_writer_template));
    protocol->writer.msg_buffer = protocol->_msg_buffer;
    protocol->writer.addrtlv_buffer = protocol->_addrtlv_buffer;
    rfc5444_reader_init(&protocol->reader);
    rfc5444_writer_init(&protocol->writer);

    protocol->writer.message_generation_notifier = _cb_msggen_notifier;

    /* initialize processing and forwarding set */
    oonf_duplicate_set_add(&protocol->forwarded_set, OONF_DUPSET_16BIT);
    oonf_duplicate_set_add(&protocol->processed_set, OONF_DUPSET_16BIT);

    /* init interface subtree */
    avl_init(&protocol->_interface_tree, avl_comp_strcasecmp, false);
  }

  OONF_INFO(LOG_RFC5444, "Add protocol %s (refcount was %d)", name, protocol->_refcount);

  /* keep track of reference count */
  protocol->_refcount++;

  return protocol;
}